

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall
SQCompilation::CheckerVisitor::putIntoGlobalNamesMap
          (CheckerVisitor *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>_>
          *map,DiagnosticsId diag,SQChar *name,Node *d)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  value_type *in_RSI;
  long in_RDI;
  Node *in_R8;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>,_bool>
  pVar5;
  int in_stack_0000003c;
  int in_stack_00000040;
  DiagnosticsId in_stack_00000044;
  SQCompilationContext *in_stack_00000048;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>,_bool>
  it2_1;
  iterator it;
  string key;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  it2;
  IdLocation loc;
  iterator fnIt;
  string sourcenameCache;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3f;
  key_type *in_stack_fffffffffffffe40;
  value_type *in_stack_fffffffffffffe48;
  vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>
  *in_stack_fffffffffffffe50;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>
  *this_00;
  value_type *in_stack_fffffffffffffe58;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffe74;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe80;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>
  local_148;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>
  *local_f0;
  undefined1 local_e8;
  _Self local_e0;
  _Self local_d8;
  allocator<char> local_c9;
  string local_c8 [32];
  _Base_ptr local_a8;
  undefined1 local_a0;
  _Base_ptr local_98;
  undefined1 local_90;
  _Self local_88;
  undefined8 local_80;
  int local_78;
  int local_74;
  undefined1 local_70;
  _Self local_68 [3];
  allocator<char> local_49;
  string local_48 [32];
  Node *local_28;
  value_type *local_10;
  
  local_28 = in_R8;
  local_10 = in_RSI;
  SQCompilationContext::sourceName(*(SQCompilationContext **)(in_RDI + 0x18));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe80._M_node,
             (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  std::allocator<char>::~allocator(&local_49);
  local_68[0]._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  local_88._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
  bVar1 = std::operator==(local_68,&local_88);
  if (bVar1) {
    pVar4 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    in_stack_fffffffffffffe80 = pVar4.first._M_node;
    local_a0 = pVar4.second;
    in_stack_fffffffffffffe7c = CONCAT13(local_a0,(int3)in_stack_fffffffffffffe7c);
    local_a8 = in_stack_fffffffffffffe80._M_node;
    local_98 = in_stack_fffffffffffffe80._M_node;
    local_90 = local_a0;
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator->((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x186e1d);
    local_80 = std::__cxx11::string::c_str();
  }
  else {
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator->((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x186e7b);
    local_80 = std::__cxx11::string::c_str();
  }
  iVar2 = Node::lineStart(local_28);
  local_78 = iVar2;
  iVar3 = Node::columnStart(local_28);
  local_74 = iVar3;
  local_70 = SQCompilationContext::isDisabled
                       (in_stack_00000048,in_stack_00000044,in_stack_00000040,in_stack_0000003c);
  uVar6 = CONCAT13(local_70,(int3)in_stack_fffffffffffffe70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe80._M_node,(char *)CONCAT44(in_stack_fffffffffffffe7c,iVar2),
             (allocator<char> *)CONCAT44(iVar3,uVar6));
  std::allocator<char>::~allocator(&local_c9);
  local_d8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>_>
               *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),(key_type *)0x186f57)
  ;
  local_e0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>_>
              *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
  bVar1 = std::operator!=(&local_d8,&local_e0);
  if (bVar1) {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>
                  *)0x186fa8);
    std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>::push_back
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  }
  else {
    local_148.first._M_dataplus = (_Alloc_hider)0x0;
    local_148.first._1_7_ = 0;
    local_148.first._M_string_length = 0;
    local_148.first.field_2._M_allocated_capacity = 0;
    this_00 = &local_148;
    std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>::vector
              ((vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_> *)
               0x187038);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>,_true>
              (this_00,&local_10->first,
               (vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_> *)
               in_stack_fffffffffffffe40);
    pVar5 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>_>
            ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>_>
                      *)this_00,local_10);
    local_f0 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>
                *)pVar5.first._M_node;
    local_e8 = pVar5.second;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>
    ::~pair(local_f0);
    std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>::~vector
              ((vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_> *)
               this_00);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>
                  *)0x1870c2);
    std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>::push_back
              ((vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_> *)
               this_00,(value_type *)local_10);
  }
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void CheckerVisitor::putIntoGlobalNamesMap(std::map<std::string, std::vector<IdLocation>> &map, enum DiagnosticsId diag, const SQChar *name, const Node *d) {

  std::string sourcenameCache(_ctx.sourceName());

  auto fnIt = fileNames.find(sourcenameCache);
  IdLocation loc;

  if (fnIt == fileNames.end()) {
    auto it2 = fileNames.insert(sourcenameCache);
    loc.filename = it2.first->c_str();
  }
  else {
    loc.filename = fnIt->c_str();
  }

  loc.line = d->lineStart();
  loc.column = d->columnStart();
  loc.diagSilenced = _ctx.isDisabled(diag, loc.line, loc.column);

  std::string key(name);

  auto it = map.find(key);

  if (it != map.end()) {
    it->second.push_back(loc);
  }
  else {
    auto it2 = map.insert({ key, std::vector<IdLocation>() });
    it2.first->second.push_back(loc);
  }
}